

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void handleSelectionRequest(XEvent *event)

{
  Display *pDVar1;
  char *__s;
  size_t sVar2;
  Atom AVar3;
  Atom AVar4;
  ulong uVar5;
  Window WVar6;
  Atom AVar7;
  long *plVar8;
  undefined8 uVar9;
  undefined4 local_158 [2];
  XEvent reply;
  Atom targets [4];
  unsigned_long itemCount;
  unsigned_long bytesAfter;
  Display *pDStack_60;
  int actualFormat;
  Window local_58;
  ulong local_50;
  Atom local_48;
  long local_40;
  char *local_38;
  
  AVar4 = 0;
  memset(local_158,0,0xc0);
  pDVar1 = _glfw.x11.display;
  local_158[0] = 0x1f;
  AVar7 = (event->xselectionrequest).property;
  if (AVar7 == 0) goto LAB_0011be7f;
  AVar4 = (event->xkey).time;
  if (AVar4 == _glfw.x11.TARGETS) {
    plVar8 = reply.pad + 0x17;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = 0x1f;
    WVar6 = (event->xkey).root;
    uVar9 = 4;
    AVar3 = 4;
    reply.pad[0x17] = AVar4;
LAB_0011bd2c:
    XChangeProperty(_glfw.x11.display,WVar6,AVar7,AVar3,0x20,0,plVar8,uVar9);
  }
  else {
    local_38 = *(char **)((long)_glfw.x11.keynames +
                         (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    if (AVar4 != _glfw.x11.MULTIPLE) {
      if (AVar4 != _glfw.x11.SAVE_TARGETS) {
        if (AVar4 == 0x1f || AVar4 == _glfw.x11.UTF8_STRING) {
          WVar6 = (event->xkey).root;
          sVar2 = strlen(local_38);
          XChangeProperty(pDVar1,WVar6,AVar7,AVar4,8,0,local_38,sVar2);
          AVar4 = (event->xselectionrequest).property;
        }
        else {
          AVar4 = 0;
        }
        goto LAB_0011be7f;
      }
      WVar6 = (event->xkey).root;
      uVar9 = 0;
      plVar8 = (long *)0x0;
      AVar3 = _glfw.x11.NULL_;
      goto LAB_0011bd2c;
    }
    local_48 = _glfw.x11.UTF8_STRING;
    XGetWindowProperty(_glfw.x11.display,(event->xkey).root,AVar7,0,0x7fffffffffffffff,0,
                       _glfw.x11.ATOM_PAIR,reply.pad + 0x17,(long)&bytesAfter + 4,targets + 3,
                       &itemCount,&local_40);
    __s = local_38;
    if (targets[3] != 0) {
      uVar5 = 0;
      local_50 = targets[3];
      AVar7 = local_48;
      do {
        AVar4 = *(Atom *)(local_40 + uVar5 * 8);
        if (AVar4 == 0x1f || AVar4 == AVar7) {
          pDStack_60 = _glfw.x11.display;
          local_58 = (event->xkey).root;
          uVar9 = *(undefined8 *)(local_40 + 8 + uVar5 * 8);
          sVar2 = strlen(__s);
          XChangeProperty(pDStack_60,local_58,uVar9,AVar4,8,0,__s,sVar2);
          AVar7 = local_48;
          targets[3] = local_50;
        }
        else {
          *(undefined8 *)(local_40 + 8 + uVar5 * 8) = 0;
        }
        uVar5 = uVar5 + 2;
      } while (uVar5 < targets[3]);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,local_40,targets[3]);
    XFree(local_40);
  }
  AVar4 = (event->xselectionrequest).property;
LAB_0011be7f:
  reply.xerror.resourceid = (XID)(event->xany).display;
  reply.xany.display = (Display *)(event->xkey).root;
  reply.xany.window = (event->xkey).subwindow;
  reply.xkey.root = (event->xkey).time;
  reply.xkey.time = (event->xconfigure).above;
  reply.xkey.subwindow = AVar4;
  XSendEvent(_glfw.x11.display,reply.xany.display,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}